

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

void __thiscall
Glucose::Clause::Clause<Glucose::vec<Glucose::Lit>>
          (Clause *this,vec<Glucose::Lit> *ps,int _extra_size,bool learnt)

{
  uint uVar1;
  Lit *pLVar2;
  ulong uVar3;
  uint uVar4;
  undefined7 in_register_00000009;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar5 = (_extra_size & 3U) * 0x10;
  uVar6 = (ulong)(uVar5 + (int)CONCAT71(in_register_00000009,learnt) * 4) |
          *(ulong *)&this->header & 0xffffffffffffff48;
  *(ulong *)&this->header = uVar6;
  uVar1 = ps->sz;
  uVar3 = (ulong)uVar1;
  *(ulong *)&this->header = (CONCAT44(uVar1,(int)uVar6) & 0xffffffff80000034) + 8;
  if (0 < ps->sz) {
    pLVar2 = ps->data;
    lVar7 = 0;
    do {
      *(int *)(&this[1].header.field_0x0 + lVar7 * 4) = pLVar2[lVar7].x;
      lVar7 = lVar7 + 1;
    } while (lVar7 < ps->sz);
  }
  if ((_extra_size & 3U) != 0) {
    if (learnt) {
      *(undefined4 *)(&this[1].header.field_0x0 + uVar3 * 4) = 0;
    }
    else {
      if ((int)uVar1 < 1) {
        uVar4 = 0;
      }
      else {
        uVar6 = 0;
        uVar4 = 0;
        do {
          uVar4 = uVar4 | 1 << ((byte)(&this[1].header.field_0x0)[uVar6 * 4] >> 1 & 0x1f);
          uVar6 = uVar6 + 1;
        } while (uVar3 != uVar6);
      }
      *(uint *)(&this[1].header.field_0x0 + uVar3 * 4) = uVar4;
    }
    if (0x1f < uVar5) {
      *(undefined4 *)(&this[1].header.field_0x0 + (ulong)(uVar1 + 1) * 4) = 0;
    }
  }
  return;
}

Assistant:

Clause(const V& ps, int _extra_size, bool learnt) {
	assert(_extra_size < (1<<2));
        header.mark      = 0;
        header.learnt    = learnt;
        header.extra_size = _extra_size;
            header.reloced   = 0;
        header.size      = ps.size();
	header.lbd = 0;
	header.canbedel = 1;
	header.exported = 0; 
	header.oneWatched = 0;
	header.seen = 0;
        for (int i = 0; i < ps.size(); i++) 
            data[i].lit = ps[i];
	
        if (header.extra_size > 0){
	  if (header.learnt) 
                data[header.size].act = 0; 
            else 
                calcAbstraction();
	  if (header.extra_size > 1) {
	      data[header.size+1].abs = 0; // learntFrom
	  }	      
	}
    }